

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::ViewRelation::GetAlias_abi_cxx11_(string *__return_storage_ptr__,ViewRelation *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->view_name);
  return __return_storage_ptr__;
}

Assistant:

string ViewRelation::GetAlias() {
	D_ASSERT(!view_name.empty());
	return view_name;
}